

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceCountQuantity::buildCustomUI(SurfaceCountQuantity *this)

{
  byte bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ScaledValue<float> *this_00;
  char *in_RDI;
  string *in_stack_ffffffffffffff68;
  SurfaceCountQuantity *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  string local_28 [4];
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float *in_stack_ffffffffffffffe8;
  float *in_stack_fffffffffffffff0;
  char *label;
  
  label = in_RDI;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(in_RDI + 0x108));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"##colormap_picker",(allocator *)&stack0xffffffffffffffd7);
  bVar1 = render::buildColormapSelector
                    ((string *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  if ((bVar1 & 1) != 0) {
    in_stack_ffffffffffffff70 = (SurfaceCountQuantity *)(in_RDI + 0x108);
    PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::manuallyChanged(in_stack_ffffffffffffffa0);
    pbVar3 = PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff78 = (string *)&stack0xffffffffffffffa0;
    std::__cxx11::string::string(in_stack_ffffffffffffff78,(string *)pbVar3);
    setColorMap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff80));
  }
  ImGui::Text("Sum: %d",(ulong)*(uint *)(in_RDI + 0x9c));
  ImGui::DragFloatRange2
            (label,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  this_00 = PersistentValue<polyscope::ScaledValue<float>_>::get
                      ((PersistentValue<polyscope::ScaledValue<float>_> *)(in_RDI + 0xe0));
  ScaledValue<float>::getValuePtr(this_00);
  bVar2 = ImGui::SliderFloat((char *)CONCAT17(bVar1,in_stack_ffffffffffffff80),
                             (float *)in_stack_ffffffffffffff78,
                             (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                             SUB84(in_stack_ffffffffffffff70,0),(char *)in_stack_ffffffffffffff68,
                             0.0);
  if (bVar2) {
    PersistentValue<polyscope::ScaledValue<float>_>::manuallyChanged
              ((PersistentValue<polyscope::ScaledValue<float>_> *)in_stack_ffffffffffffff70);
    requestRedraw();
  }
  return;
}

Assistant:

void SurfaceCountQuantity::buildCustomUI() {

  if (render::buildColormapSelector(colorMap.get())) {
    colorMap.manuallyChanged();
    setColorMap(colorMap.get());
    program.reset();
  }
  ImGui::Text("Sum: %d", sum);

  ImGui::DragFloatRange2("Color Range", &vizRangeLow, &vizRangeHigh, (dataRangeHigh - dataRangeLow) / 100.,
                         dataRangeLow, dataRangeHigh, "Min: %.3e", "Max: %.3e");

  if (ImGui::SliderFloat("Radius", pointRadius.get().getValuePtr(), 0.0, .1, "%.5f", 3.)) {
    pointRadius.manuallyChanged();
    requestRedraw();
  }
}